

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_access_ghost_ptr(Integer g_a,Integer *dims,void *ptr,Integer *ld)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer proc;
  Integer IVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  C_Integer CVar11;
  size_t __n;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int _ndim;
  ulong uVar15;
  long lVar16;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi [7];
  Integer lo [7];
  int local_148 [8];
  long local_128 [8];
  long local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  lVar8 = g_a + 1000;
  sVar1 = GA[lVar8].ndim;
  lVar16 = (long)sVar1;
  proc = pnga_nodeid();
  pnga_distribution(g_a,proc,local_68,local_a8);
  if (0 < lVar16) {
    memset(dims,0,lVar16 * 8);
  }
  pgVar5 = GA;
  uVar2 = GA[lVar8].ndim;
  uVar15 = (ulong)(short)uVar2;
  iVar9 = GA[lVar8].distr_type;
  if (iVar9 - 1U < 3) {
    lVar7 = GA[lVar8].num_blocks[0];
    lVar10 = (long)(int)proc % lVar7;
    local_148[0] = (int)lVar10;
    if (1 < (short)uVar2) {
      lVar14 = 0;
      IVar6 = proc;
      do {
        IVar6 = (long)((int)IVar6 - (int)lVar10) / lVar7;
        lVar7 = GA[g_a + 1000].num_blocks[lVar14 + 1];
        lVar10 = (long)(int)IVar6 % lVar7;
        local_148[lVar14 + 1] = (int)lVar10;
        lVar14 = lVar14 + 1;
      } while ((uVar15 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar2) {
      lVar7 = 0;
      do {
        iVar9 = *(int *)((long)local_148 + lVar7);
        lVar10 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
        *(long *)((long)local_e8 + lVar7 * 2) = lVar10 * iVar9 + 1;
        lVar10 = ((long)iVar9 + 1) * lVar10;
        lVar14 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
        if (lVar14 <= lVar10) {
          lVar10 = lVar14;
        }
        *(long *)((long)local_128 + lVar7 * 2) = lVar10;
        lVar7 = lVar7 + 4;
      } while ((uVar15 & 0xffffffff) << 2 != lVar7);
    }
    goto LAB_00185241;
  }
  if (iVar9 == 4) {
    lVar7 = GA[lVar8].num_blocks[0];
    lVar10 = (long)(int)proc % lVar7;
    local_148[0] = (int)lVar10;
    if (1 < (short)uVar2) {
      lVar14 = 0;
      IVar6 = proc;
      do {
        IVar6 = (long)((int)IVar6 - (int)lVar10) / lVar7;
        lVar7 = GA[g_a + 1000].num_blocks[lVar14 + 1];
        lVar10 = (long)(int)IVar6 % lVar7;
        local_148[lVar14 + 1] = (int)lVar10;
        lVar14 = lVar14 + 1;
      } while ((uVar15 & 0xffffffff) - 1 != lVar14);
    }
    if (0 < (short)uVar2) {
      pCVar4 = GA[lVar8].mapc;
      lVar7 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_148 + lVar7);
        lVar14 = (long)iVar9 + (long)iVar3;
        *(C_Integer *)((long)local_e8 + lVar7 * 2) = pCVar4[lVar14];
        lVar10 = *(long *)((long)GA[lVar8].num_blocks + lVar7 * 2);
        if ((long)iVar3 < lVar10 + -1) {
          lVar14 = pCVar4[lVar14 + 1] + -1;
        }
        else {
          lVar14 = *(long *)((long)GA[lVar8].dims + lVar7 * 2);
        }
        *(long *)((long)local_128 + lVar7 * 2) = lVar14;
        iVar9 = iVar9 + (int)lVar10;
        lVar7 = lVar7 + 4;
      } while ((uVar15 & 0xffffffff) << 2 != lVar7);
    }
    goto LAB_00185241;
  }
  if (iVar9 != 0) goto LAB_00185241;
  if (GA[lVar8].num_rstrctd == 0) {
    if ((short)uVar2 < 1) goto LAB_00185241;
    lVar7 = 1;
    uVar12 = 0;
    do {
      lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
    if ((-1 < proc) && (proc < lVar7)) {
      if (0 < (short)uVar2) {
        pCVar4 = GA[lVar8].mapc;
        uVar12 = 0;
        lVar7 = 0;
        IVar6 = proc;
        do {
          lVar14 = (long)GA[g_a + 1000].nblock[uVar12];
          lVar10 = IVar6 % lVar14;
          local_e8[uVar12] = pCVar4[lVar10 + lVar7];
          if (lVar10 == lVar14 + -1) {
            CVar11 = GA[g_a + 1000].dims[uVar12];
          }
          else {
            CVar11 = pCVar4[lVar10 + lVar7 + 1] + -1;
          }
          lVar7 = lVar7 + lVar14;
          local_128[uVar12] = CVar11;
          uVar12 = uVar12 + 1;
          IVar6 = IVar6 / lVar14;
        } while (uVar15 != uVar12);
      }
      goto LAB_00185241;
    }
LAB_00185206:
    if ((short)uVar2 < 1) goto LAB_00185241;
    __n = uVar15 * 8;
  }
  else {
    if (proc < GA[lVar8].num_rstrctd) {
      if ((short)uVar2 < 1) goto LAB_00185241;
      lVar7 = 1;
      uVar12 = 0;
      do {
        lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
      if ((-1 < proc) && (proc < lVar7)) {
        if (0 < (short)uVar2) {
          pCVar4 = GA[lVar8].mapc;
          lVar7 = 0;
          uVar12 = 0;
          IVar6 = proc;
          do {
            lVar14 = (long)GA[g_a + 1000].nblock[uVar12];
            lVar10 = IVar6 % lVar14;
            local_e8[uVar12] = pCVar4[lVar10 + lVar7];
            if (lVar10 == lVar14 + -1) {
              CVar11 = GA[g_a + 1000].dims[uVar12];
            }
            else {
              CVar11 = pCVar4[lVar10 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar14;
            local_128[uVar12] = CVar11;
            uVar12 = uVar12 + 1;
            IVar6 = IVar6 / lVar14;
          } while (uVar15 != uVar12);
        }
        goto LAB_00185241;
      }
      goto LAB_00185206;
    }
    if ((short)uVar2 < 1) goto LAB_00185241;
    __n = (ulong)uVar2 << 3;
  }
  memset(local_e8,0,__n);
  memset(local_128,0xff,__n);
LAB_00185241:
  if (uVar15 == 1) {
    *ld = (local_128[0] - local_e8[0]) + pgVar5[lVar8].width[0] * 2 + 1;
  }
  if ((short)uVar2 < 2) {
    lVar7 = 1;
    lVar10 = 0;
  }
  else {
    lVar7 = 1;
    lVar14 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + dims[lVar14] * lVar7;
      lVar13 = (local_128[lVar14] - local_e8[lVar14]) + pgVar5[g_a + 1000].width[lVar14] * 2 + 1;
      ld[lVar14] = lVar13;
      lVar7 = lVar7 * lVar13;
      lVar14 = lVar14 + 1;
    } while (uVar15 - 1 != lVar14);
  }
  *(char **)ptr =
       pgVar5[lVar8].ptr[proc] + (long)pgVar5[lVar8].elemsize * (lVar7 * dims[uVar15 - 1] + lVar10);
  pgVar5 = GA;
  if (0 < sVar1) {
    lVar8 = 0;
    do {
      dims[lVar8] = (local_a8[lVar8] - local_68[lVar8]) + pgVar5[g_a + 1000].width[lVar8] * 2 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar16 != lVar8);
  }
  return;
}

Assistant:

void pnga_access_ghost_ptr(Integer g_a, Integer dims[],
                      void* ptr, Integer ld[])

{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i, lo[MAXDIM], hi[MAXDIM];
Integer ndim = GA[handle].ndim;
Integer me = pnga_nodeid();


   pnga_distribution(g_a, me, lo, hi);

   for (i=0; i < ndim; i++) {
     dims[i] = 0;
   }

   gam_LocationWithGhosts(me, handle, dims, &lptr, ld);
   *(char**)ptr = lptr; 
   for (i=0; i < ndim; i++)
     dims[i] = hi[i] - lo[i] + 1 + 2*(Integer)GA[handle].width[i];
}